

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O1

void __thiscall
TransactionContext_SequenceApiTestWithKey_Test::TestBody
          (TransactionContext_SequenceApiTestWithKey_Test *this)

{
  ByteData *pBVar1;
  Txid *this_00;
  pointer pcVar2;
  pointer puVar3;
  bool bVar4;
  _func_int *message;
  char *message_00;
  long lVar5;
  Amount AVar6;
  initializer_list<cfd::UtxoData> __l;
  AssertionResult gtest_ar;
  Amount fee;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  AddressFactory factory;
  TransactionContext txc;
  AssertionResult gtest_ar_1;
  Address address;
  UtxoData utxo2;
  Address address2;
  UtxoData utxo1;
  undefined1 local_18a0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1898;
  AssertHelperData local_1890;
  ByteData local_1858;
  string local_1840;
  Pubkey local_1820;
  Amount local_1808;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_17f8;
  SigHashType local_17e0;
  SigHashType local_17d4;
  AddressFactory local_17c8;
  TransactionContext local_17a0;
  undefined1 local_16e8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_16e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_16d8;
  uchar local_16c8 [16];
  pointer local_16b8;
  pointer local_16a0;
  pointer local_1688;
  TapBranch local_1670;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_15f8;
  Script local_15e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_15a0 [19];
  UtxoData local_11f8;
  undefined1 local_d00 [32];
  undefined1 local_ce0 [16];
  pointer local_cd0;
  pointer local_cb8;
  pointer local_ca0;
  TapBranch local_c88;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_c10;
  Script local_bf8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_bb8;
  UtxoData local_b88;
  Address local_698;
  UtxoData local_520;
  
  cfd::AddressFactory::AddressFactory(&local_17c8,kRegtest);
  cfd::UtxoData::UtxoData(&local_520);
  local_520.block_height = 0;
  local_520.binary_data = (void *)0x0;
  pBVar1 = &local_b88.block_hash.data_;
  local_b88.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b88,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_16e8,(string *)&local_b88);
  this_00 = &local_520.txid;
  cfd::core::Txid::operator=(this_00,(Txid *)local_16e8);
  local_16e8 = (undefined1  [8])&PTR__Txid_00735400;
  if (sStack_16e0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_16e0.ptr_);
  }
  if ((ByteData *)local_b88.block_height != pBVar1) {
    operator_delete((void *)local_b88.block_height);
  }
  local_520.vout = 0;
  local_b88.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b88,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac","");
  cfd::core::Script::Script((Script *)local_16e8,(string *)&local_b88);
  cfd::core::Script::operator=(&local_520.locking_script,(Script *)local_16e8);
  cfd::core::Script::~Script((Script *)local_16e8);
  if ((ByteData *)local_b88.block_height != pBVar1) {
    operator_delete((void *)local_b88.block_height);
  }
  local_b88.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b88,"n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW","");
  cfd::AddressFactory::GetAddress((Address *)local_16e8,&local_17c8,(string *)&local_b88);
  cfd::core::Address::operator=(&local_520.address,(Address *)local_16e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_15a0);
  cfd::core::Script::~Script(&local_15e0);
  local_1670._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_15f8)
  ;
  cfd::core::TapBranch::~TapBranch(&local_1670);
  if (local_1688 != (pointer)0x0) {
    operator_delete(local_1688);
  }
  if (local_16a0 != (pointer)0x0) {
    operator_delete(local_16a0);
  }
  if (local_16b8 != (pointer)0x0) {
    operator_delete(local_16b8);
  }
  if ((uchar *)local_16d8._M_allocated_capacity != local_16c8) {
    operator_delete((void *)local_16d8._M_allocated_capacity);
  }
  if ((ByteData *)local_b88.block_height != pBVar1) {
    operator_delete((void *)local_b88.block_height);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_520.descriptor,0,(char *)local_520.descriptor._M_string_length,0x58eab2);
  cfd::core::Amount::Amount((Amount *)local_16e8,10000000);
  local_520.amount.ignore_check_ = sStack_16e0.ptr_._0_1_;
  local_520.amount.amount_ = (int64_t)local_16e8;
  local_520.address_type = kP2pkhAddress;
  cfd::UtxoData::UtxoData(&local_b88);
  local_b88.block_height = 0;
  local_b88.binary_data = (void *)0x0;
  pcVar2 = local_d00 + 0x10;
  local_d00._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d00,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",
             "");
  cfd::core::Txid::Txid((Txid *)local_16e8,(string *)local_d00);
  cfd::core::Txid::operator=(&local_b88.txid,(Txid *)local_16e8);
  local_16e8 = (undefined1  [8])&PTR__Txid_00735400;
  if (sStack_16e0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_16e0.ptr_);
  }
  if ((pointer)local_d00._0_8_ != pcVar2) {
    operator_delete((void *)local_d00._0_8_);
  }
  local_b88.vout = 0;
  local_d00._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d00,"a9145d54db96a28f844a744e393fcd699d6f825b284187","");
  cfd::core::Script::Script((Script *)local_16e8,(string *)local_d00);
  cfd::core::Script::operator=(&local_b88.locking_script,(Script *)local_16e8);
  cfd::core::Script::~Script((Script *)local_16e8);
  if ((pointer)local_d00._0_8_ != pcVar2) {
    operator_delete((void *)local_d00._0_8_);
  }
  local_d00._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d00,"2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16","");
  cfd::AddressFactory::GetAddress((Address *)local_16e8,&local_17c8,(string *)local_d00);
  cfd::core::Address::operator=(&local_b88.address,(Address *)local_16e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_15a0);
  cfd::core::Script::~Script(&local_15e0);
  local_1670._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_15f8)
  ;
  cfd::core::TapBranch::~TapBranch(&local_1670);
  if (local_1688 != (pointer)0x0) {
    operator_delete(local_1688);
  }
  if (local_16a0 != (pointer)0x0) {
    operator_delete(local_16a0);
  }
  if (local_16b8 != (pointer)0x0) {
    operator_delete(local_16b8);
  }
  if ((uchar *)local_16d8._M_allocated_capacity != local_16c8) {
    operator_delete((void *)local_16d8._M_allocated_capacity);
  }
  if ((pointer)local_d00._0_8_ != pcVar2) {
    operator_delete((void *)local_d00._0_8_);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_b88.descriptor,0,(char *)local_b88.descriptor._M_string_length,0x554123);
  cfd::core::Amount::Amount((Amount *)local_16e8,180000);
  local_b88.amount.ignore_check_ = sStack_16e0.ptr_._0_1_;
  local_b88.amount.amount_ = (int64_t)local_16e8;
  local_b88.address_type = kP2shP2wpkhAddress;
  local_16e8 = (undefined1  [8])&local_16d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16e8,"mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo","");
  cfd::core::Address::Address((Address *)local_d00,(string *)local_16e8);
  if (local_16e8 != (undefined1  [8])&local_16d8) {
    operator_delete((void *)local_16e8);
  }
  local_16e8 = (undefined1  [8])&local_16d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16e8,"bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu","");
  cfd::core::Address::Address(&local_698,(string *)local_16e8);
  if (local_16e8 != (undefined1  [8])&local_16d8) {
    operator_delete((void *)local_16e8);
  }
  cfd::core::Amount::Amount(&local_1808,10000);
  cfd::TransactionContext::TransactionContext(&local_17a0,2,0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::TransactionContext::AddInput(&local_17a0,&local_520);
    }
  }
  else {
    testing::Message::Message((Message *)local_16e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_18a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x1b4,
               "Expected: txc.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_18a0,(Message *)local_16e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_18a0);
    if (local_16e8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_16e8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_16e8 + 8))();
      }
      local_16e8 = (undefined1  [8])0x0;
    }
  }
  cfd::core::OutPoint::OutPoint((OutPoint *)local_16e8,&local_b88.txid,local_b88.vout);
  cfd::TransactionContext::AddTxIn(&local_17a0,(OutPoint *)local_16e8);
  local_16e8 = (undefined1  [8])&PTR__Txid_00735400;
  if (sStack_16e0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_16e0.ptr_);
  }
  AVar6 = cfd::core::operator-(&local_520.amount,&local_1808);
  local_16e8 = (undefined1  [8])AVar6.amount_;
  sStack_16e0.ptr_._0_1_ = AVar6.ignore_check_;
  cfd::TransactionContext::AddTxOut(&local_17a0,(Address *)local_d00,(Amount *)local_16e8);
  cfd::TransactionContext::AddTxOut(&local_17a0,&local_698,&local_b88.amount);
  cfd::UtxoData::UtxoData((UtxoData *)local_16e8,&local_520);
  cfd::UtxoData::UtxoData(&local_11f8,&local_b88);
  __l._M_len = 2;
  __l._M_array = (iterator)local_16e8;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&local_17f8,__l,(allocator_type *)local_18a0);
  lVar5 = 0x4f0;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(local_16e8 + lVar5));
    lVar5 = lVar5 + -0x4f0;
  } while (lVar5 != -0x4f0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::TransactionContext::CollectInputUtxo(&local_17a0,&local_17f8);
    }
  }
  else {
    testing::Message::Message((Message *)local_16e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_18a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x1ba,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_18a0,(Message *)local_16e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_18a0);
    if (local_16e8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_16e8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_16e8 + 8))();
      }
      local_16e8 = (undefined1  [8])0x0;
    }
  }
  cfd::core::ByteData::ByteData(&local_1858);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_16e8,this_00,local_520.vout);
      local_18a0 = (undefined1  [8])&local_1890;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_18a0,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_1820,(string *)local_18a0);
      local_1840._M_dataplus._M_p = (pointer)&local_1840.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1840,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif((Privkey *)&local_1890.message,&local_1840,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_17d4);
      cfd::TransactionContext::SignWithKey
                (&local_17a0,(OutPoint *)local_16e8,&local_1820,(Privkey *)&local_1890.message,
                 &local_17d4,true,(ByteData256 *)0x0,(ByteData *)0x0);
      if (local_1890.message._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_1890.message._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1840._M_dataplus._M_p != &local_1840.field_2) {
        operator_delete(local_1840._M_dataplus._M_p);
      }
      if (local_1820.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1820.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_18a0 != (undefined1  [8])&local_1890) {
        operator_delete((void *)local_18a0);
      }
      local_16e8 = (undefined1  [8])&PTR__Txid_00735400;
      if (sStack_16e0.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_16e0.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_16e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_18a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x1c1,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_18a0,(Message *)local_16e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_18a0);
    if (local_16e8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_16e8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_16e8 + 8))();
      }
      local_16e8 = (undefined1  [8])0x0;
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_16e8,this_00,local_520.vout);
      cfd::TransactionContext::Verify(&local_17a0,(OutPoint *)local_16e8);
      local_16e8 = (undefined1  [8])&PTR__Txid_00735400;
      if (sStack_16e0.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_16e0.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_16e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_18a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x1c2,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_18a0,(Message *)local_16e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_18a0);
    if (local_16e8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_16e8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_16e8 + 8))();
      }
      local_16e8 = (undefined1  [8])0x0;
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::TransactionContext::Finalize((ByteData *)local_16e8,&local_17a0);
    puVar3 = local_1858.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_1858.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_16e8;
    local_1858.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)sStack_16e0.ptr_;
    local_1858.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_16d8._M_allocated_capacity;
    local_16e8 = (undefined1  [8])0x0;
    sStack_16e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_16d8._M_allocated_capacity = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar3 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(puVar3);
    }
    if (local_16e8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_16e8);
    }
  }
  testing::Message::Message((Message *)local_16e8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_18a0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
             ,0x1c4,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_18a0,(Message *)local_16e8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_18a0);
  if (local_16e8 != (undefined1  [8])0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) && (local_16e8 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_16e8 + 8))();
    }
    local_16e8 = (undefined1  [8])0x0;
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_16e8,&local_b88.txid,local_b88.vout);
      local_18a0 = (undefined1  [8])&local_1890;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_18a0,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27","");
      cfd::core::Pubkey::Pubkey(&local_1820,(string *)local_18a0);
      local_1840._M_dataplus._M_p = (pointer)&local_1840.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1840,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP","");
      cfd::core::Privkey::FromWif((Privkey *)&local_1890.message,&local_1840,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_17e0);
      cfd::TransactionContext::SignWithKey
                (&local_17a0,(OutPoint *)local_16e8,&local_1820,(Privkey *)&local_1890.message,
                 &local_17e0,true,(ByteData256 *)0x0,(ByteData *)0x0);
      if (local_1890.message._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_1890.message._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1840._M_dataplus._M_p != &local_1840.field_2) {
        operator_delete(local_1840._M_dataplus._M_p);
      }
      if (local_1820.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1820.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_18a0 != (undefined1  [8])&local_1890) {
        operator_delete((void *)local_18a0);
      }
      local_16e8 = (undefined1  [8])&PTR__Txid_00735400;
      if (sStack_16e0.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_16e0.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_16e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_18a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x1c9,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_18a0,(Message *)local_16e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_18a0);
    if (local_16e8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_16e8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_16e8 + 8))();
      }
      local_16e8 = (undefined1  [8])0x0;
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_16e8,&local_b88.txid,local_b88.vout);
      cfd::TransactionContext::Verify(&local_17a0,(OutPoint *)local_16e8);
      local_16e8 = (undefined1  [8])&PTR__Txid_00735400;
      if (sStack_16e0.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_16e0.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_16e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_18a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x1ca,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_18a0,(Message *)local_16e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_18a0);
    if (local_16e8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_16e8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_16e8 + 8))();
      }
      local_16e8 = (undefined1  [8])0x0;
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::TransactionContext::Finalize((ByteData *)local_16e8,&local_17a0);
      puVar3 = local_1858.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_1858.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_16e8;
      local_1858.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)sStack_16e0.ptr_;
      local_1858.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_16d8._M_allocated_capacity;
      local_16e8 = (undefined1  [8])0x0;
      sStack_16e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_16d8._M_allocated_capacity = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar3 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(puVar3);
      }
      if (local_16e8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_16e8);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_16e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_18a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x1cb,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_18a0,(Message *)local_16e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_18a0);
    if (local_16e8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_16e8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_16e8 + 8))();
      }
      local_16e8 = (undefined1  [8])0x0;
    }
  }
  AVar6 = cfd::TransactionContext::GetFeeAmount(&local_17a0);
  local_18a0 = (undefined1  [8])AVar6.amount_;
  local_1898.ptr_._0_1_ = AVar6.ignore_check_;
  local_1890.message._M_dataplus._M_p =
       (pointer)cfd::core::Amount::GetSatoshiValue((Amount *)local_18a0);
  local_1840._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue(&local_1808);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_16e8,"txc.GetFeeAmount().GetSatoshiValue()","fee.GetSatoshiValue()",
             (long *)&local_1890.message,(long *)&local_1840);
  if (local_16e8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_18a0);
    if (sStack_16e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      message = (_func_int *)0x62864a;
    }
    else {
      message = (_func_int *)((sStack_16e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1890.message,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x1cc,(char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_1890.message,(Message *)local_18a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1890.message);
    if (local_18a0 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_18a0 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_18a0 + 8))();
      }
      local_18a0 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_16e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_16e8,&local_1858);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_18a0,"tx.GetHex().c_str()",
             "\"02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000\""
             ,(char *)local_16e8,
             "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000"
            );
  if (local_16e8 != (undefined1  [8])&local_16d8) {
    operator_delete((void *)local_16e8);
  }
  if (local_18a0[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_16e8);
    if ((undefined8 *)CONCAT71(local_1898.ptr_._1_7_,local_1898.ptr_._0_1_) == (undefined8 *)0x0) {
      message_00 = "";
    }
    else {
      message_00 = *(char **)CONCAT71(local_1898.ptr_._1_7_,local_1898.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1890.message,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x1cd,message_00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_1890.message,(Message *)local_16e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1890.message);
    if (local_16e8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_16e8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_16e8 + 8))();
      }
      local_16e8 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1898,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1858.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_1858.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_17f8);
  cfd::TransactionContext::~TransactionContext(&local_17a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_698.format_data_);
  cfd::core::Script::~Script(&local_698.redeem_script_);
  local_698.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_698.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_698.script_tree_.super_TapBranch);
  if (local_698.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_698.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_698.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_698.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_698.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_698.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698.address_._M_dataplus._M_p != &local_698.address_.field_2) {
    operator_delete(local_698.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_bb8);
  cfd::core::Script::~Script(&local_bf8);
  local_c88._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_c10);
  cfd::core::TapBranch::~TapBranch(&local_c88);
  if (local_ca0 != (pointer)0x0) {
    operator_delete(local_ca0);
  }
  if (local_cb8 != (pointer)0x0) {
    operator_delete(local_cb8);
  }
  if (local_cd0 != (pointer)0x0) {
    operator_delete(local_cd0);
  }
  if ((undefined1 *)local_d00._16_8_ != local_ce0) {
    operator_delete((void *)local_d00._16_8_);
  }
  cfd::UtxoData::~UtxoData(&local_b88);
  cfd::UtxoData::~UtxoData(&local_520);
  local_17c8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_00733578;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_17c8.prefix_list_);
  return;
}

Assistant:

TEST(TransactionContext, SequenceApiTestWithKey)
{
  AddressFactory factory(NetType::kRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2pkhAddress;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address("mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2("bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu");

  Amount fee(int64_t{10000});
  TransactionContext txc(2, 0);
  EXPECT_NO_THROW(txc.AddInput(utxo1));
  txc.AddTxIn(OutPoint(utxo2.txid, utxo2.vout));
  txc.AddTxOut(address, utxo1.amount - fee);
  txc.AddTxOut(address2, utxo2.amount);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000");
}